

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall gmlc::networking::TcpConnection::closeNoWait(TcpConnection *this)

{
  ConnectionStates CVar1;
  element_type *peVar2;
  int iVar3;
  long *plVar4;
  error_code ec;
  allocator<char> local_e9;
  int local_e8 [2];
  long *local_e0;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  LOCK();
  (this->triggerhalt)._M_base._M_i = true;
  UNLOCK();
  CVar1 = (this->state)._M_i;
  if (((uint)(CVar1 + 0xfffffffd) < 2) ||
     ((CVar1 == PRESTART && (((this->receivingHalt).activated._M_base._M_i & 1U) != 0)))) {
    concurrency::TriggerVariable::trigger(&this->receivingHalt);
  }
  local_e8[0] = 0;
  plVar4 = (long *)std::_V2::system_category();
  local_e0 = plVar4;
  iVar3 = (*((this->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Socket[8])();
  if ((char)iVar3 != '\0') {
    peVar2 = (this->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Socket[9])(peVar2,local_e8);
    if (local_e8[0] != 0) {
      if ((local_e8[0] != 0x68) && (local_e8[0] != 0x6b)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"error occurred sending shutdown::",&local_e9);
        (**(code **)(*local_e0 + 0x20))(&local_b8,local_e0,local_e8[0]);
        std::operator+(&local_78,&local_98,&local_b8);
        std::operator+(&local_58,&local_78," ");
        CLI::std::__cxx11::to_string(&local_d8,local_e8[0]);
        std::operator+(&local_38,&local_58,&local_d8);
        logger(this,0,(string *)&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_98);
      }
      local_e8[0] = 0;
      local_e0 = plVar4;
    }
  }
  peVar2 = (this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar2->_vptr_Socket[10])(peVar2,local_e8);
  return;
}

Assistant:

void TcpConnection::closeNoWait()
{
    triggerhalt.store(true);
    switch (state.load()) {
        case ConnectionStates::PRESTART:
            if (receivingHalt.isActive()) {
                receivingHalt.trigger();
            }
            break;
        case ConnectionStates::HALTED:
        case ConnectionStates::CLOSED:
            receivingHalt.trigger();
            break;
        default:
            break;
    }

    std::error_code ec;
    if (socket_->is_open()) {
        socket_->shutdown(ec);
        if (ec) {
            if ((ec.value() != asio::error::not_connected) &&
                (ec.value() != asio::error::connection_reset)) {
                logger(
                    0,
                    std::string("error occurred sending shutdown::") +
                        ec.message() + " " + std::to_string(ec.value()));
            }
            ec.clear();
        }
        socket_->close(ec);
    } else {
        socket_->close(ec);
    }
}